

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O1

bool __thiscall
ObjectModelBuilder::buildObject(ObjectModelBuilder *this,value *value,Object *parent,Class *clazz)

{
  pointer *pppOVar1;
  key_type *__k;
  string *this_00;
  long *plVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  value *pvVar3;
  pointer pcVar4;
  iterator __position;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  undefined8 uVar6;
  Class *pCVar7;
  _Alloc_hider _Var8;
  bool bVar9;
  int iVar10;
  iterator iVar11;
  mapped_type *pmVar12;
  const_iterator cVar13;
  Binding *__p;
  string *psVar14;
  _Base_ptr p_Var15;
  const_iterator cVar16;
  array *paVar17;
  ostream *poVar18;
  Class *clazz_00;
  long *plVar19;
  pointer x;
  value *x_00;
  ObjectModelBuilder *this_02;
  ObjectModelBuilder *pOVar20;
  int iVar21;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
  *this_03;
  Object *pOVar22;
  bool bVar23;
  shared_ptr<Binding> binding;
  string typeName;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
  member;
  string id;
  undefined1 local_88 [8];
  Property classProperty;
  Object *instance;
  
  if (value->type_ != 5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"error: \'root\' entry in class=\'",0x1e);
    poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(clazz->name)._M_dataplus._M_p,
                         (clazz->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\' is not a JSON object...",0x19);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
    std::ostream::put((char)poVar18);
    std::ostream::flush();
    return false;
  }
  this_00 = (value->u_).string_;
  findStringInObject((string *)
                     &binding.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     (object *)this_00,"class");
  if (typeName._M_dataplus._M_p == (pointer)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"error: object has empty or missing \'class\' in class=\'",0x35
              );
    poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(clazz->name)._M_dataplus._M_p,
                         (clazz->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\', ",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
    std::ostream::put((char)poVar18);
    std::ostream::flush();
    bVar9 = false;
    goto LAB_0010ee77;
  }
  findStringInObject((string *)local_88,(object *)this_00,"id");
  uniqueIdentifier((string *)&member.second.u_,this,clazz_00,(string *)local_88);
  if (local_88 != (undefined1  [8])&classProperty.name) {
    operator_delete((void *)local_88);
  }
  classProperty.type.field_2._8_8_ = operator_new(0x78);
  *(undefined8 *)(classProperty.type.field_2._8_8_ + 0x10) = 0;
  *(undefined8 *)(classProperty.type.field_2._8_8_ + 0x18) = 0;
  *(undefined8 *)(classProperty.type.field_2._8_8_ + 0x20) = 0;
  *(undefined8 *)(classProperty.type.field_2._8_8_ + 0x28) = 0;
  *(undefined8 *)(classProperty.type.field_2._8_8_ + 0x30) = 0;
  *(undefined8 *)(classProperty.type.field_2._8_8_ + 0x38) = 0;
  *(undefined8 *)(classProperty.type.field_2._8_8_ + 0x40) = 0;
  *(undefined8 *)(classProperty.type.field_2._8_8_ + 0x48) = 0;
  *(undefined8 *)(classProperty.type.field_2._8_8_ + 0x50) = 0;
  *(undefined8 *)(classProperty.type.field_2._8_8_ + 0x58) = 0;
  *(undefined8 *)(classProperty.type.field_2._8_8_ + 0x60) = 0;
  *(undefined8 *)(classProperty.type.field_2._8_8_ + 0x68) = 0;
  *(undefined8 *)(classProperty.type.field_2._8_8_ + 0x70) = 0;
  *(undefined8 *)classProperty.type.field_2._8_8_ = 0;
  *(undefined8 *)(classProperty.type.field_2._8_8_ + 8) = 0;
  *(undefined8 **)(classProperty.type.field_2._8_8_ + 0x10) =
       (undefined8 *)(classProperty.type.field_2._8_8_ + 0x20);
  *(undefined8 *)(classProperty.type.field_2._8_8_ + 0x18) = 0;
  *(undefined1 *)(classProperty.type.field_2._8_8_ + 0x20) = 0;
  *(undefined4 *)(classProperty.type.field_2._8_8_ + 0x38) = 0;
  *(undefined8 *)(classProperty.type.field_2._8_8_ + 0x40) = 0;
  *(undefined8 **)(classProperty.type.field_2._8_8_ + 0x48) =
       (undefined8 *)(classProperty.type.field_2._8_8_ + 0x38);
  *(undefined8 **)(classProperty.type.field_2._8_8_ + 0x50) =
       (undefined8 *)(classProperty.type.field_2._8_8_ + 0x38);
  *(undefined8 *)(classProperty.type.field_2._8_8_ + 0x58) = 0;
  *(undefined8 *)(classProperty.type.field_2._8_8_ + 0x60) = 0;
  *(undefined8 *)(classProperty.type.field_2._8_8_ + 0x68) = 0;
  *(undefined8 *)(classProperty.type.field_2._8_8_ + 0x70) = 0;
  *(Object **)(classProperty.type.field_2._8_8_ + 8) = parent;
  std::__cxx11::string::_M_assign((string *)(classProperty.type.field_2._8_8_ + 0x10));
  iVar11 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>_>
           ::find(&(this->m_classes)._M_t,
                  (key_type *)
                  &binding.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if ((_Rb_tree_header *)iVar11._M_node == &(this->m_classes)._M_t._M_impl.super__Rb_tree_header) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"error: unknown class=",0x15);
    poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         (char *)binding.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi,(long)typeName._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,", for object id=",0x10);
    poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar18,(char *)member.second.u_.string_,(long)id._M_dataplus._M_p);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
    std::ostream::put((char)poVar18);
    std::ostream::flush();
    goto LAB_0010ee60;
  }
  *(undefined8 *)classProperty.type.field_2._8_8_ = *(undefined8 *)(iVar11._M_node + 2);
  p_Var15 = *(_Base_ptr *)((long)&this_00->field_2 + 8);
  id.field_2._8_8_ = &this_00->_M_string_length;
  if (p_Var15 != (_Base_ptr)id.field_2._8_8_) {
    do {
      this_03 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
                 *)(typeName.field_2._M_local_buf + 8);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
      ::pair(this_03,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
                      *)(p_Var15 + 1));
      iVar10 = std::__cxx11::string::compare((char *)this_03);
      iVar21 = 3;
      if (((iVar10 != 0) && (iVar10 = std::__cxx11::string::compare((char *)this_03), iVar10 != 0))
         && (iVar10 = std::__cxx11::string::compare((char *)this_03), iVar10 != 0)) {
        plVar19 = *(long **)(*(long *)classProperty.type.field_2._8_8_ + 0x60);
        plVar2 = *(long **)(*(long *)classProperty.type.field_2._8_8_ + 0x68);
        if (plVar19 != plVar2) {
          bVar9 = false;
          do {
            local_88 = (undefined1  [8])*plVar19;
            classProperty.clazz = (Class *)&classProperty.name._M_string_length;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&classProperty,plVar19[1],plVar19[2] + plVar19[1]);
            classProperty.name.field_2._8_8_ = &classProperty.type._M_string_length;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)((long)&classProperty.name.field_2 + 8),plVar19[5],
                       plVar19[6] + plVar19[5]);
            pcVar4 = (pointer)CONCAT71(classProperty.name._M_dataplus._M_p._1_7_,
                                       classProperty.name._M_dataplus._M_p._0_1_);
            if (pcVar4 == member.first._M_dataplus._M_p) {
              if (pcVar4 == (pointer)0x0) {
                bVar23 = true;
              }
              else {
                iVar10 = bcmp(classProperty.clazz,(void *)typeName.field_2._8_8_,(size_t)pcVar4);
                bVar23 = iVar10 == 0;
              }
            }
            else {
              bVar23 = false;
            }
            if (bVar23) {
              bVar9 = true;
            }
            if ((size_type *)classProperty.name.field_2._8_8_ !=
                &classProperty.type._M_string_length) {
              operator_delete((void *)classProperty.name.field_2._8_8_);
            }
            if (classProperty.clazz != (Class *)&classProperty.name._M_string_length) {
              operator_delete(classProperty.clazz);
            }
            uVar6 = member.second._0_8_;
            plVar19 = plVar19 + 9;
          } while (!bVar23 && plVar19 != plVar2);
          __k = (key_type *)((long)&typeName.field_2 + 8);
          if (bVar9) {
            if (member.first.field_2._8_4_ == 5) {
              local_88 = (undefined1  [8])&classProperty.name;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"bind","");
              cVar16 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                               *)uVar6,(key_type *)local_88);
              if (local_88 != (undefined1  [8])&classProperty.name) {
                operator_delete((void *)local_88);
              }
              local_88 = (undefined1  [8])&classProperty.name;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"to","");
              cVar13 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                               *)uVar6,(key_type *)local_88);
              if (local_88 != (undefined1  [8])&classProperty.name) {
                operator_delete((void *)local_88);
              }
              if (((cVar16._M_node == (_Base_ptr)(uVar6 + 8)) ||
                  (cVar13._M_node == (_Base_ptr)(uVar6 + 8) || cVar16._M_node[2]._M_color != 3)) ||
                 (1 < cVar13._M_node[2]._M_color - 3)) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"error: malformed binding in object id=",0x26);
                poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,(char *)member.second.u_.string_,
                                     (long)id._M_dataplus._M_p);
                std::__ostream_insert<char,std::char_traits<char>>(poVar18,", class=",8);
                poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar18,(char *)binding.
                                                  super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi,(long)typeName._M_dataplus._M_p
                                    );
                std::__ostream_insert<char,std::char_traits<char>>(poVar18,", property=",0xb);
                poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar18,(char *)typeName.field_2._8_8_,
                                     (long)member.first._M_dataplus._M_p);
                iVar21 = 1;
                std::endl<char,std::char_traits<char>>(poVar18);
              }
              else {
                __p = (Binding *)operator_new(0x38);
                (__p->expression)._M_dataplus._M_p = (pointer)0x0;
                (__p->expression)._M_string_length = 0;
                (__p->expression).field_2._M_allocated_capacity = 0;
                *(undefined8 *)((long)&(__p->expression).field_2 + 8) = 0;
                (__p->dependencies).
                super__Vector_base<Binding::Dependency,_std::allocator<Binding::Dependency>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                (__p->dependencies).
                super__Vector_base<Binding::Dependency,_std::allocator<Binding::Dependency>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                (__p->dependencies).
                super__Vector_base<Binding::Dependency,_std::allocator<Binding::Dependency>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                (__p->expression)._M_dataplus._M_p = (pointer)&(__p->expression).field_2;
                (__p->expression)._M_string_length = 0;
                (__p->expression).field_2._M_local_buf[0] = '\0';
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Binding*>
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&binding,__p);
                pOVar20 = (ObjectModelBuilder *)(cVar13._M_node + 2);
                if (*(_Rb_tree_color *)&(pOVar20->m_ids)._M_t._M_impl == 3) {
                  this_02 = pOVar20;
                  psVar14 = picojson::value::get<std::__cxx11::string>((value *)pOVar20);
                  bVar9 = buildBindingDependency
                                    (this_02,__p,psVar14,(Object *)classProperty.type.field_2._8_8_,
                                     clazz);
                  if (bVar9) {
LAB_0010e8de:
                    picojson::value::get<std::__cxx11::string>((value *)(cVar16._M_node + 2));
                    std::__cxx11::string::_M_assign((string *)__p);
                    local_88 = (undefined1  [8])&classProperty.name;
                    classProperty.clazz = (Class *)0x0;
                    classProperty.name._M_dataplus._M_p._0_1_ = 0;
                    classProperty.type._M_dataplus._M_p = (pointer)0x0;
                    classProperty.type._M_string_length._0_4_ = 3;
                    classProperty.name.field_2._8_8_ = __p;
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&classProperty.type,
                               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&binding);
                    pmVar12 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value>_>_>
                                            *)(classProperty.type.field_2._8_8_ + 0x30),
                                           (key_type *)((long)&typeName.field_2 + 8));
                    Value::operator=(pmVar12,(Value *)local_88);
                    Value::~Value((Value *)local_88);
                    iVar21 = 0;
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"error: malformed binding dependency=",0x24);
                    psVar14 = picojson::value::get<std::__cxx11::string>((value *)pOVar20);
                    poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cerr,(psVar14->_M_dataplus)._M_p,
                                         psVar14->_M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar18,", in object id=",0xf);
                    poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar18,(char *)member.second.u_.string_,
                                         (long)id._M_dataplus._M_p);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar18,", class=",8);
                    poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar18,(char *)binding.
                                                  super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi,(long)typeName._M_dataplus._M_p
                                        );
                    std::__ostream_insert<char,std::char_traits<char>>(poVar18,", property=",0xb);
                    poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar18,(char *)typeName.field_2._8_8_,
                                         (long)member.first._M_dataplus._M_p);
                    iVar21 = 1;
                    std::endl<char,std::char_traits<char>>(poVar18);
                  }
                }
                else {
                  paVar17 = picojson::value::
                            get<std::vector<picojson::value,std::allocator<picojson::value>>>
                                      ((value *)pOVar20);
                  pvVar3 = (paVar17->
                           super__Vector_base<picojson::value,_std::allocator<picojson::value>_>).
                           _M_impl.super__Vector_impl_data._M_finish;
                  iVar21 = 6;
                  for (x_00 = (paVar17->
                              super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)
                              ._M_impl.super__Vector_impl_data._M_start; bVar9 = x_00 == pvVar3,
                      !bVar9; x_00 = x_00 + 1) {
                    picojson::value::value((value *)local_88,x_00);
                    if (local_88._0_4_ != 3) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,
                                 "error: binding dependency needs to be a JSON string, id=",0x38);
                      poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cerr,(char *)member.second.u_.string_,
                                           (long)id._M_dataplus._M_p);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar18,", property=",0xb);
                      poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar18,(char *)typeName.field_2._8_8_,
                                           (long)member.first._M_dataplus._M_p);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar18,", class=",8);
                      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)&binding.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>;
LAB_0010e8af:
                      poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar18,(char *)((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  ((long)paVar5 + 8))->_M_pi,
                                           *(long *)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                     ((long)paVar5 + 8) + 1));
                      std::endl<char,std::char_traits<char>>(poVar18);
                      picojson::value::~value((value *)local_88);
                      iVar21 = 1;
                      break;
                    }
                    pOVar20 = (ObjectModelBuilder *)local_88;
                    psVar14 = picojson::value::get<std::__cxx11::string>((value *)pOVar20);
                    bVar23 = buildBindingDependency
                                       (pOVar20,__p,psVar14,
                                        (Object *)classProperty.type.field_2._8_8_,clazz);
                    if (!bVar23) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,"error: malformed binding dependency=",0x24);
                      paVar5 = &typeName.field_2;
                      psVar14 = picojson::value::get<std::__cxx11::string>((value *)local_88);
                      poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cerr,(psVar14->_M_dataplus)._M_p,
                                           psVar14->_M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar18,", in object id=",0xf);
                      poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar18,(char *)member.second.u_.string_,
                                           (long)id._M_dataplus._M_p);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar18,", class=",8);
                      poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar18,(char *)binding.
                                                  super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi,(long)typeName._M_dataplus._M_p
                                          );
                      std::__ostream_insert<char,std::char_traits<char>>(poVar18,", property=",0xb);
                      goto LAB_0010e8af;
                    }
                    picojson::value::~value((value *)local_88);
                  }
                  if (bVar9) goto LAB_0010e8de;
                }
                if (binding.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                    (element_type *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             binding.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ;
                }
              }
              if (iVar21 != 0) goto LAB_0010e62e;
            }
            else {
              if (member.first.field_2._8_4_ == 3) {
                Value::string((Value *)local_88,(string *)member.second._0_8_);
                pmVar12 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value>_>_>
                                        *)(classProperty.type.field_2._8_8_ + 0x30),__k);
              }
              else {
                if (member.first.field_2._8_4_ != 2) goto LAB_0010e62b;
                local_88 = (undefined1  [8])&classProperty.name;
                classProperty.clazz = (Class *)0x0;
                classProperty.name._M_dataplus._M_p._0_1_ = 0;
                classProperty.name.field_2._8_8_ = 0;
                classProperty.type._M_dataplus._M_p = (pointer)0x0;
                classProperty.type._M_string_length._0_4_ = 1;
                classProperty.name.field_2._M_allocated_capacity = member.second._0_8_;
                pmVar12 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value>_>_>
                                        *)(classProperty.type.field_2._8_8_ + 0x30),__k);
              }
              std::__cxx11::string::operator=((string *)pmVar12,(string *)local_88);
              _Var8 = classProperty.type._M_dataplus;
              uVar6 = classProperty.name.field_2._8_8_;
              pmVar12->numberValue = (double)classProperty.name.field_2._M_allocated_capacity;
              classProperty.name.field_2._8_8_ = 0;
              classProperty.type._M_dataplus._M_p = (pointer)0x0;
              this_01 = (pmVar12->bindingValue).
                        super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
              (pmVar12->bindingValue).super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = (element_type *)uVar6;
              (pmVar12->bindingValue).super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var8._M_p;
              if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
              }
              pmVar12->type = (uint)classProperty.type._M_string_length;
              if (classProperty.type._M_dataplus._M_p != (pointer)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           classProperty.type._M_dataplus._M_p);
              }
              if (local_88 != (undefined1  [8])&classProperty.name) {
                operator_delete((void *)local_88);
              }
            }
LAB_0010e62b:
            iVar21 = 0;
            goto LAB_0010e62e;
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"error: object id=",0x11);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,(char *)member.second.u_.string_,
                             (long)id._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,", class=",8);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar18,(char *)binding.
                                             super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount._M_pi,(long)typeName._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,", unknown property=",0x13);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar18,(char *)typeName.field_2._8_8_,
                             (long)member.first._M_dataplus._M_p);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
        std::ostream::put((char)poVar18);
        iVar21 = 1;
        std::ostream::flush();
      }
LAB_0010e62e:
      uVar6 = member.second._0_8_;
      if (member.first.field_2._8_4_ == 5) {
        if (member.second._0_8_ != 0) {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                       *)member.second._0_8_);
          goto LAB_0010e68c;
        }
      }
      else if (member.first.field_2._8_4_ == 4) {
        if (member.second._0_8_ != 0) {
          std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
                    ((vector<picojson::value,_std::allocator<picojson::value>_> *)
                     member.second._0_8_);
          goto LAB_0010e68c;
        }
      }
      else if ((member.first.field_2._8_4_ == 3) && (member.second._0_8_ != 0)) {
        if (*(void **)member.second._0_8_ != (void *)(member.second._0_8_ + 0x10)) {
          operator_delete(*(void **)member.second._0_8_);
        }
LAB_0010e68c:
        operator_delete((void *)uVar6);
      }
      if ((size_type *)typeName.field_2._8_8_ != &member.first._M_string_length) {
        operator_delete((void *)typeName.field_2._8_8_);
      }
      if ((iVar21 != 3) && (iVar21 != 0)) goto LAB_0010eaff;
      p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
    } while (p_Var15 != (_Base_ptr)id.field_2._8_8_);
    iVar21 = 2;
LAB_0010eaff:
    if (iVar21 != 2) goto LAB_0010ee60;
  }
  local_88 = (undefined1  [8])&classProperty.name;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"children","");
  cVar16 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                   *)this_00,(key_type *)local_88);
  if (local_88 != (undefined1  [8])&classProperty.name) {
    operator_delete((void *)local_88);
  }
  if (cVar16._M_node == (_Base_ptr)id.field_2._8_8_) {
LAB_0010ec64:
    if (this->m_verbose == true) {
      local_88 = (undefined1  [8])&classProperty.name;
      classProperty.clazz = (Class *)0x0;
      classProperty.name._M_dataplus._M_p._0_1_ = 0;
      if (parent != (Object *)0x0) {
        pOVar22 = parent;
        do {
          std::__cxx11::string::append(local_88);
          pOVar22 = pOVar22->parent;
        } while (pOVar22 != (Object *)0x0);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," - object: ",0xb);
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,(char *)local_88,(long)classProperty.clazz);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"id=",3);
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar18,(char *)member.second.u_.string_,(long)id._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,", class=",8);
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar18,(char *)binding.
                                           super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>.
                                           _M_refcount._M_pi,(long)typeName._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,", children=",0xb);
      poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)poVar18);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
      std::ostream::put((char)poVar18);
      std::ostream::flush();
      if (local_88 != (undefined1  [8])&classProperty.name) {
        operator_delete((void *)local_88);
      }
    }
    if (parent == (Object *)0x0) {
      clazz->root = (Object *)classProperty.type.field_2._8_8_;
    }
    else {
      __position._M_current =
           (parent->children).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (parent->children).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        bVar9 = true;
        std::vector<Object*,std::allocator<Object*>>::_M_realloc_insert<Object*const&>
                  ((vector<Object*,std::allocator<Object*>> *)&parent->children,__position,
                   (Object **)((long)&classProperty.type.field_2 + 8));
        goto LAB_0010ee62;
      }
      *__position._M_current = (Object *)classProperty.type.field_2._8_8_;
      pppOVar1 = &(parent->children).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl
                  .super__Vector_impl_data._M_finish;
      *pppOVar1 = *pppOVar1 + 1;
    }
    bVar9 = true;
  }
  else {
    if (cVar16._M_node[2]._M_color == 5) {
      bVar9 = buildObject(this,(value *)(cVar16._M_node + 2),
                          (Object *)classProperty.type.field_2._8_8_,clazz);
      if (bVar9) goto LAB_0010ec64;
    }
    else {
      if (cVar16._M_node[2]._M_color == 4) {
        paVar17 = picojson::value::get<std::vector<picojson::value,std::allocator<picojson::value>>>
                            ((value *)(cVar16._M_node + 2));
        x = (paVar17->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)._M_impl
            .super__Vector_impl_data._M_start;
        id.field_2._8_8_ =
             (paVar17->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (x != (pointer)id.field_2._8_8_) {
          do {
            picojson::value::value((value *)local_88,x);
            bVar9 = buildObject(this,(value *)local_88,(Object *)classProperty.type.field_2._8_8_,
                                clazz);
            pCVar7 = classProperty.clazz;
            if (local_88._0_4_ == 5) {
              if (classProperty.clazz != (Class *)0x0) {
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                             *)classProperty.clazz);
                goto LAB_0010ec19;
              }
            }
            else if (local_88._0_4_ == 4) {
              if (classProperty.clazz != (Class *)0x0) {
                std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
                          ((vector<picojson::value,_std::allocator<picojson::value>_> *)
                           classProperty.clazz);
                goto LAB_0010ec19;
              }
            }
            else if ((local_88._0_4_ == 3) && (classProperty.clazz != (Class *)0x0)) {
              pcVar4 = ((classProperty.clazz)->name)._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar4 != &((classProperty.clazz)->name).field_2) {
                operator_delete(pcVar4);
              }
LAB_0010ec19:
              operator_delete(pCVar7);
            }
            if (!bVar9) goto LAB_0010ee60;
            x = x + 1;
          } while (x != (pointer)id.field_2._8_8_);
        }
        goto LAB_0010ec64;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"error: object id=",0x11);
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,(char *)member.second.u_.string_,
                           (long)id._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18," of class=",10);
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar18,(char *)binding.
                                           super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>.
                                           _M_refcount._M_pi,(long)typeName._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar18,", has invalid children, must be JSON array or object",0x34);
      std::endl<char,std::char_traits<char>>(poVar18);
    }
LAB_0010ee60:
    bVar9 = false;
  }
LAB_0010ee62:
  if (member.second.u_.string_ != (string *)&id._M_string_length) {
    operator_delete(member.second.u_.string_);
  }
LAB_0010ee77:
  if (binding.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&typeName._M_string_length) {
    operator_delete(binding.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi);
  }
  return bVar9;
}

Assistant:

bool ObjectModelBuilder::buildObject(const picojson::value &value, Object *parent, Class *clazz)
{
    if (!value.is<picojson::object>()) {
        std::cerr << "error: 'root' entry in class='" << clazz->name << "' is not a JSON object..." << std::endl;
        return false;
    }

    const picojson::object &object = value.get<picojson::object>();

    std::string typeName = findStringInObject(object, "class");
    if (typeName.empty()) {
        std::cerr << "error: object has empty or missing 'class' in class='" << clazz->name << "', " << std::endl;
        return false;
    }

    std::string id = uniqueIdentifier(clazz, (findStringInObject(object, "id")));

    Object *instance = new Object();
    instance->parent = parent;
    instance->id = id;

    auto classIt = m_classes.find(typeName);
    if (classIt == m_classes.end()) {
        std::cerr << "error: unknown class=" << typeName << ", for object id=" << id << std::endl;
        return false;
    }
    instance->clazz = classIt->second;

    // Parse out the properties and values..
    for (auto member : object) {
        const std::string &key = member.first;

        // These are special cased above and below
        if (key == "children" || key == "id" || key == "class")
            continue;

        // Verify that the class in question actually has the property
        bool exists = false;
        for (auto classProperty : instance->clazz->properties) {
            if (classProperty.name == key) {
                exists = true;
                break;
            }
        }
        if (!exists) {
            std::cerr << "error: object id=" << id << ", class=" << typeName << ", unknown property=" << key << std::endl;
            return false;
        }

        const picojson::value &propertyValue = member.second;
        if (propertyValue.is<double>()) {
            instance->propertyValues[key] = Value::number(propertyValue.get<double>());
        } else if (propertyValue.is<std::string>()) {
            instance->propertyValues[key] = Value::string(propertyValue.get<std::string>());
        } else if (propertyValue.is<picojson::object>()) {
            const picojson::object &binding = propertyValue.get<picojson::object>();
            auto bind = binding.find("bind");
            auto to = binding.find("to");

            if (bind != binding.end() && bind->second.is<std::string>()
                && to != binding.end() && (to->second.is<std::string>() || to->second.is<picojson::array>())) {
                std::shared_ptr<Binding> binding(new Binding());
                if (to->second.is<std::string>()) {
                    if (!buildBindingDependency(binding.get(), to->second.get<std::string>(), instance, clazz)) {
                        std::cerr << "error: malformed binding dependency=" << to->second.get<std::string>() << ", in object id="
                                  << id << ", class=" << typeName << ", property=" << key << std::endl;
                        return false;
                    }
                } else {
                    for (auto i : to->second.get<picojson::array>()) {
                        if (!i.is<std::string>()) {
                            std::cerr << "error: binding dependency needs to be a JSON string, id=" << id << ", property="
                                      << key << ", class=" << typeName << std::endl;
                            return false;
                        }
                        if (!buildBindingDependency(binding.get(), i.get<std::string>(), instance, clazz)) {
                            std::cerr << "error: malformed binding dependency=" << i.get<std::string>() << ", in object id="
                                      << id << ", class=" << typeName << ", property=" << key << std::endl;
                            return false;
                        }
                    }
                }
                binding->expression = bind->second.get<std::string>();
                instance->propertyValues[key] = Value::binding(binding);
            } else {
                std::cerr << "error: malformed binding in object id=" << id << ", class=" << typeName
                          << ", property=" << key << std::endl;
                return false;
            }
        }
    }

    // Recursively traverse the children..
    auto childrenIt = object.find("children");
    if (childrenIt != object.end()) {
        const picojson::value &children = childrenIt->second;
        if (children.is<picojson::array>()) {
            for (auto child : children.get<picojson::array>())
                if (!buildObject(child, instance, clazz))
                    return false;
        } else if (children.is<picojson::object>()) {
            if (!buildObject(children, instance, clazz))
                return false;
        } else {
            std::cerr << "error: object id=" << id << " of class=" << typeName << ", has invalid children, must be JSON array or object" << std::endl;
            return false;
        }
    }

    if (m_verbose) {
        std::string padding;
        Object *p = parent;
        while (p) {
            padding += "  ";
            p = p->parent;
        }
        std::cerr << " - object: " << padding << "id=" << id << ", class=" << typeName << ", children=" << instance->children.size() << std::endl;
    }

    if (parent)
        parent->children.push_back(instance);
    else
        clazz->root = instance;

    return true;
}